

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

void __thiscall FpgaIO::~FpgaIO(FpgaIO *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

FpgaIO::~FpgaIO()
{
#if 0
    // Do not need this because derived class (e.g., AmpIO) also performs this check
    if (port) {
        std::cerr << "Warning: FpgaIO being destroyed while still in use by "
                  << BasePort::PortTypeString(port->GetPortType()) <<" Port" << std::endl;
        port->RemoveBoard(this);
    }
#endif
}